

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_path_equal(mg_path *lhs,mg_path *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t i;
  
  uVar1 = lhs->node_count;
  if (uVar1 != rhs->node_count) {
    return 0;
  }
  uVar2 = lhs->relationship_count;
  if (uVar2 != rhs->relationship_count) {
    return 0;
  }
  uVar3 = lhs->sequence_length;
  if (uVar3 != rhs->sequence_length) {
    return 0;
  }
  uVar6 = 0;
  while (uVar1 != uVar6) {
    iVar4 = mg_node_equal(lhs->nodes[uVar6],rhs->nodes[uVar6]);
    uVar6 = uVar6 + 1;
    if (iVar4 == 0) {
      return 0;
    }
  }
  uVar6 = 0;
  while (uVar2 != uVar6) {
    iVar4 = mg_unbound_relationship_equal(lhs->relationships[uVar6],rhs->relationships[uVar6]);
    uVar6 = uVar6 + 1;
    if (iVar4 == 0) {
      return 0;
    }
  }
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    if (uVar3 == uVar5) break;
    uVar6 = uVar5 + 1;
  } while (lhs->sequence[uVar5] == rhs->sequence[uVar5]);
  return (uint)(uVar3 <= uVar5);
}

Assistant:

int mg_path_equal(const mg_path *lhs, const mg_path *rhs) {
  if (lhs->node_count != rhs->node_count ||
      lhs->relationship_count != rhs->relationship_count ||
      lhs->sequence_length != rhs->sequence_length) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->node_count; ++i) {
    if (!mg_node_equal(lhs->nodes[i], rhs->nodes[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->relationship_count; ++i) {
    if (!mg_unbound_relationship_equal(lhs->relationships[i],
                                       rhs->relationships[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->sequence_length; ++i) {
    if (lhs->sequence[i] != rhs->sequence[i]) {
      return 0;
    }
  }
  return 1;
}